

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SlaterIntegrals.hpp
# Opt level: O0

RealType RosenB(int n,RealType alpha)

{
  uint in_EDI;
  bool bVar1;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  __type _Var6;
  uint nu;
  RealType PHyperRosenA;
  RealType TheSum;
  RealType PCoshRosenA;
  RealType PSinhRosenA;
  bool IsPositive;
  RealType Term;
  RealType RosenB_;
  int in_stack_ffffffffffffff9c;
  double in_stack_ffffffffffffffa0;
  uint local_4c;
  double local_48;
  double local_40;
  double local_20;
  double local_18;
  
  if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
    local_20 = 1.0;
    bVar1 = true;
    dVar2 = exp(in_XMM0_Qa);
    dVar3 = exp(-in_XMM0_Qa);
    dVar4 = exp(in_XMM0_Qa);
    dVar5 = exp(-in_XMM0_Qa);
    local_40 = dVar2 - dVar3;
    for (local_4c = 1; local_4c <= in_EDI; local_4c = local_4c + 1) {
      bVar1 = bVar1 == false;
      local_48 = dVar2 - dVar3;
      if (!bVar1) {
        local_48 = -dVar4 - dVar5;
      }
      local_20 = (in_XMM0_Qa / (double)local_4c) * local_20;
      local_40 = local_20 * local_48 + local_40;
    }
    local_18 = local_40 / (in_XMM0_Qa * local_20);
  }
  else {
    printf("WARNING, a = 0 in RosenB\n");
    _Var6 = std::pow<double,int>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    local_18 = (1.0 - _Var6) / ((double)(int)in_EDI + 1.0);
  }
  return local_18;
}

Assistant:

inline RealType RosenB(int n, RealType alpha) {
  RealType RosenB_;

  if (alpha != 0.) {
    RealType Term   = 1.;
    bool IsPositive = true;

    // These two expressions are (up to constant factors) equivalent
    // to computing the hyperbolic sine and cosine of a respectively
    // The series consists of adding up these terms in an alternating fashion
    RealType PSinhRosenA = exp(alpha) - exp(-alpha);
    RealType PCoshRosenA = -exp(alpha) - exp(-alpha);
    RealType TheSum      = PSinhRosenA;
    RealType PHyperRosenA;
    for (unsigned nu = 1; nu <= (unsigned)n; nu++) {
      if (IsPositive) {
        PHyperRosenA = PCoshRosenA;
        IsPositive   = false;
      } else  // term to add should be negative
      {
        PHyperRosenA = PSinhRosenA;
        IsPositive   = true;
      }
      Term *= alpha / nu;
      TheSum += Term * PHyperRosenA;
    }
    RosenB_ = TheSum / (alpha * Term);
  } else  // pathological case of a=0
  {
    printf("WARNING, a = 0 in RosenB\n");
    RosenB_ = (1. - pow(-1., n)) / (n + 1.);
  }
  return RosenB_;
}